

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-intrusive-list.cc
# Opt level: O2

void __thiscall
IntrusiveListTest_push_back_pointer_Test::TestBody(IntrusiveListTest_push_back_pointer_Test *this)

{
  vector<int,_std::allocator<int>_> *expected;
  TestObjectList local_78;
  undefined8 local_5c;
  undefined4 local_54;
  unique_ptr<(anonymous_namespace)::TestObject,_std::default_delete<(anonymous_namespace)::TestObject>_>
  local_50;
  unique_ptr<(anonymous_namespace)::TestObject,_std::default_delete<(anonymous_namespace)::TestObject>_>
  local_48;
  unique_ptr<(anonymous_namespace)::TestObject,_std::default_delete<(anonymous_namespace)::TestObject>_>
  local_40;
  TestObjectList list;
  
  list.size_ = 0;
  list.first_ = (TestObject *)0x0;
  list.last_ = (TestObject *)0x0;
  local_78.first_._0_4_ = 1;
  std::make_unique<(anonymous_namespace)::TestObject,int>((int *)&local_40);
  wabt::intrusive_list<(anonymous_namespace)::TestObject>::push_back(&list,&local_40);
  std::
  unique_ptr<(anonymous_namespace)::TestObject,_std::default_delete<(anonymous_namespace)::TestObject>_>
  ::~unique_ptr(&local_40);
  local_78.first_._0_4_ = 2;
  std::make_unique<(anonymous_namespace)::TestObject,int>((int *)&local_48);
  wabt::intrusive_list<(anonymous_namespace)::TestObject>::push_back(&list,&local_48);
  std::
  unique_ptr<(anonymous_namespace)::TestObject,_std::default_delete<(anonymous_namespace)::TestObject>_>
  ::~unique_ptr(&local_48);
  local_78.first_ = (TestObject *)CONCAT44(local_78.first_._4_4_,3);
  std::make_unique<(anonymous_namespace)::TestObject,int>((int *)&local_50);
  wabt::intrusive_list<(anonymous_namespace)::TestObject>::push_back(&list,&local_50);
  std::
  unique_ptr<(anonymous_namespace)::TestObject,_std::default_delete<(anonymous_namespace)::TestObject>_>
  ::~unique_ptr(&local_50);
  local_5c = 0x200000001;
  local_78.first_ = (TestObject *)0x0;
  local_78.last_ = (TestObject *)0x0;
  local_78.size_ = 0;
  local_54 = 3;
  std::vector<int,std::allocator<int>>::_M_range_initialize<int_const*>
            ((vector<int,std::allocator<int>> *)&local_78,&local_5c);
  anon_unknown.dwarf_6c8ba::IntrusiveListTest::AssertListEq
            ((IntrusiveListTest *)&list,&local_78,expected);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&local_78);
  wabt::intrusive_list<(anonymous_namespace)::TestObject>::clear(&list);
  return;
}

Assistant:

TEST_F(IntrusiveListTest, push_back_pointer) {
  TestObjectList list;

  list.push_back(std::make_unique<TestObject>(1));
  list.push_back(std::make_unique<TestObject>(2));
  list.push_back(std::make_unique<TestObject>(3));

  AssertListEq(list, {1, 2, 3});
}